

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * P33xThread(void *pParam)

{
  double local_40;
  double temperature;
  double pressure;
  int local_28;
  int err;
  int res;
  int id;
  P33X *pP33x;
  void *pParam_local;
  
  err = 0;
  local_28 = 1;
  pressure._4_4_ = 0;
  temperature = 0.0;
  local_40 = 0.0;
  do {
    _res = (P33X *)pParam;
    pP33x = (P33X *)pParam;
    if (addrsP33x[err] == pParam) {
      do {
        mSleep((long)(_res->threadperiod / 2));
        temperature = 0.0;
        local_28 = GetPressureP33x(_res,&temperature);
        if (local_28 != 0) {
          pressure._4_4_ = local_28;
        }
        mSleep((long)(_res->threadperiod / 2));
        local_40 = 0.0;
        local_28 = GetTemperatureP33x(_res,&local_40);
        if (local_28 != 0) {
          pressure._4_4_ = local_28;
        }
        EnterCriticalSection(P33xCS + err);
        pressureP33x[err] = temperature;
        temperatureP33x[err] = local_40;
        resP33x[err] = pressure._4_4_;
        LeaveCriticalSection(P33xCS + err);
      } while (bExitP33x[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X* pP33x = (P33X*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double pressure = 0, temperature = 0;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		mSleep(pP33x->threadperiod/2);
		pressure = 0;
		res = GetPressureP33x(pP33x, &pressure);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(pP33x->threadperiod/2);
		temperature = 0;
		res = GetTemperatureP33x(pP33x, &temperature);
		if (res != EXIT_SUCCESS) err = res;
		EnterCriticalSection(&P33xCS[id]);
		pressureP33x[id] = pressure;
		temperatureP33x[id] = temperature;
		resP33x[id] = err;
		LeaveCriticalSection(&P33xCS[id]);
		if (bExitP33x[id]) break;
	}

	return 0;
}